

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Validity * __thiscall
capnp::compiler::CompilerMain::addSource
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr file)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  Module *module;
  StringPtr pathStr;
  ModuleScope compiled;
  undefined1 local_88 [56];
  DirPathPair dirPathPair;
  
  if (this->compilerConstructed == false) {
    kj::ctor<capnp::compiler::Compiler,capnp::compiler::Compiler::AnnotationFlag&>
              ((Compiler *)&this->compilerSpace,&this->annotationFlag);
    local_88._0_8_ = &kj::DestructorOnlyDisposer<capnp::compiler::Compiler>::instance;
    local_88._8_8_ = &this->compilerSpace;
    kj::Own<capnp::compiler::Compiler,_std::nullptr_t>::operator=
              (&this->compiler,(Own<capnp::compiler::Compiler,_std::nullptr_t> *)local_88);
    kj::Own<capnp::compiler::Compiler,_std::nullptr_t>::dispose
              ((Own<capnp::compiler::Compiler,_std::nullptr_t> *)local_88);
    this->compilerConstructed = true;
  }
  if (this->addStandardImportPaths == true) {
    for (lVar3 = 8; lVar3 != 0x38; lVar3 = lVar3 + 0x10) {
      pathStr.content.size_ = *(size_t *)((long)&PTR_typeinfo_00272468 + lVar3);
      pathStr.content.ptr = (char *)this;
      getSourceDirectory((CompilerMain *)local_88,pathStr,
                         SUB81(*(undefined8 *)
                                ((long)&addSource::STANDARD_IMPORT_PATHS[0].content.ptr + lVar3),0))
      ;
      if ((Disposer *)local_88._0_8_ != (Disposer *)0x0) {
        ModuleLoader::addImportPath(&this->loader,(ReadableDirectory *)local_88._0_8_);
      }
    }
    this->addStandardImportPaths = false;
  }
  interpretSourceFile(&dirPathPair,this,file);
  ModuleLoader::loadModule
            ((ModuleLoader *)local_88,(ReadableDirectory *)&this->loader,(PathPtr)dirPathPair._0_16_
            );
  uVar1 = local_88._0_8_;
  if ((Disposer *)local_88._0_8_ == (Disposer *)0x0) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"no such file");
  }
  else {
    Compiler::add(&compiled,(this->compiler).ptr,(Module *)local_88._0_8_);
    Compiler::eagerlyCompile
              ((this->compiler).ptr,CONCAT44(compiled.id._4_4_,(undefined4)compiled.id),
               this->compileEagerness);
    local_88._0_8_ = CONCAT44(compiled.id._4_4_,(undefined4)compiled.id);
    local_88._12_4_ = compiled.compiler._4_4_;
    local_88._8_4_ = compiled.compiler._0_4_;
    local_88._16_4_ = (undefined4)compiled.id;
    local_88._20_4_ = compiled.id._4_4_;
    local_88._24_8_ = compiled.node;
    iVar2 = (*(*(_func_int ***)uVar1)[3])(uVar1);
    local_88._32_8_ = CONCAT44(extraout_var,iVar2);
    local_88._48_8_ = uVar1;
    kj::Vector<capnp::compiler::CompilerMain::SourceFile>::
    add<capnp::compiler::CompilerMain::SourceFile>(&this->sourceFiles,(SourceFile *)local_88);
    (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  }
  kj::Array<kj::String>::~Array(&dirPathPair.path.parts);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addSource(kj::StringPtr file) {
    if (!compilerConstructed) {
      compiler = compilerSpace.construct(annotationFlag);
      compilerConstructed = true;
    }

    if (addStandardImportPaths) {
      static constexpr kj::StringPtr STANDARD_IMPORT_PATHS[] = {
        "/usr/local/include"_kj,
        "/usr/include"_kj,
#ifdef CAPNP_INCLUDE_DIR
        KJ_CONCAT(CAPNP_INCLUDE_DIR, _kj),
#endif
      };
      for (auto path: STANDARD_IMPORT_PATHS) {
        KJ_IF_SOME(dir, getSourceDirectory(path, false)) {
          loader.addImportPath(dir);
        } else {
          // ignore standard path that doesn't exist
        }
      }

      addStandardImportPaths = false;
    }

    auto dirPathPair = interpretSourceFile(file);
    KJ_IF_SOME(module, loader.loadModule(dirPathPair.dir, dirPathPair.path)) {
      auto compiled = compiler->add(module);
      compiler->eagerlyCompile(compiled.getId(), compileEagerness);
      sourceFiles.add(SourceFile { compiled.getId(), compiled, module.getSourceName(), &module });
    } else {
      return "no such file";
    }